

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O0

void __thiscall direct_solvers::SetUp(direct_solvers *this)

{
  Solver_Config config;
  Solver_Config config_00;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  Scalar SStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  Scalar SStack_48;
  undefined1 local_40 [8];
  Solver_Config data;
  direct_solvers *this_local;
  
  data.SOR_relaxation = (Scalar)this;
  Disa::Solver_Config::Solver_Config((Solver_Config *)local_40);
  local_40._0_4_ = lower_upper_factorisation;
  local_40[4] = false;
  memcpy(&local_70,local_40,0x30);
  config.factor_tolerance = (Scalar)uStack_68;
  config.type = (undefined4)local_70;
  config.pivot = (bool)local_70._4_1_;
  config._5_3_ = local_70._5_3_;
  config.minimum_iterations = local_60;
  config.maximum_iterations = uStack_58;
  config.convergence_tolerance = (Scalar)local_50;
  config.SOR_relaxation = SStack_48;
  Disa::Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_0UL>::
  initialise((Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_0UL>
              *)&this->lu_solver,config);
  local_40[4] = true;
  memcpy(&local_a0,local_40,0x30);
  config_00.factor_tolerance = (Scalar)uStack_98;
  config_00.type = (undefined4)local_a0;
  config_00.pivot = (bool)local_a0._4_1_;
  config_00._5_3_ = local_a0._5_3_;
  config_00.minimum_iterations = local_90;
  config_00.maximum_iterations = uStack_88;
  config_00.convergence_tolerance = (Scalar)local_80;
  config_00.SOR_relaxation = SStack_78;
  Disa::Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_0UL>::
  initialise((Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_0UL> *
             )&this->lup_solver,config_00);
  return;
}

Assistant:

void SetUp() override {
    Solver_Config data;
    data.type = Solver_Type::lower_upper_factorisation;
    data.pivot = false;
    lu_solver.initialise(data);
    data.pivot = true;
    lup_solver.initialise(data);
  }